

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCMakeInputs
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *this_00;
  string *psVar1;
  Value *pVVar2;
  Value result;
  string cmakeRootDir;
  Value local_98;
  Value local_70;
  Value local_48;
  
  if ((int)this->m_State < 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"This instance was not yet configured.",
               (allocator<char> *)&cmakeRootDir);
    cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&result);
    pVVar2 = &result;
  }
  else {
    this_00 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
              super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
              super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
              super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
    psVar1 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    std::__cxx11::string::string((string *)&cmakeRootDir,(string *)psVar1);
    psVar1 = cmake::GetHomeDirectory_abi_cxx11_(this_00);
    Json::Value::Value(&result,objectValue);
    Json::Value::Value(&local_48,psVar1);
    pVVar2 = Json::Value::operator[](&result,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_48);
    Json::Value::~Value(&local_48);
    Json::Value::Value(&local_70,&cmakeRootDir);
    pVVar2 = Json::Value::operator[](&result,&kCMAKE_ROOT_DIRECTORY_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_70);
    Json::Value::~Value(&local_70);
    cmDumpCMakeInputs(&local_98,this_00);
    pVVar2 = Json::Value::operator[](&result,&kBUILD_FILES_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_98);
    Json::Value::~Value(&local_98);
    cmServerRequest::Reply(__return_storage_ptr__,request,&result);
    Json::Value::~Value(&result);
    pVVar2 = (Value *)&cmakeRootDir;
  }
  std::__cxx11::string::~string((string *)pVVar2);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCMakeInputs(
  const cmServerRequest& request)
{
  if (this->m_State < STATE_CONFIGURED) {
    return request.ReportError("This instance was not yet configured.");
  }

  const cmake* cm = this->CMakeInstance();
  const std::string cmakeRootDir = cmSystemTools::GetCMakeRoot();
  const std::string& sourceDir = cm->GetHomeDirectory();

  Json::Value result = Json::objectValue;
  result[kSOURCE_DIRECTORY_KEY] = sourceDir;
  result[kCMAKE_ROOT_DIRECTORY_KEY] = cmakeRootDir;
  result[kBUILD_FILES_KEY] = cmDumpCMakeInputs(cm);
  return request.Reply(result);
}